

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O3

bool __thiscall
WrittenFontTrueType::AddToANSIRepresentation
          (WrittenFontTrueType *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  unsigned_short inEncodedCharacter;
  WrittenFontRepresentation *pWVar3;
  bool bVar4;
  _Rb_tree_color _Var5;
  _Node *p_Var6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  UShortList candidates;
  UShortListList candidatesList;
  GlyphEncodingInfo local_e8;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  WrittenFontTrueType *local_b8;
  _List_node_base local_b0;
  undefined8 local_a0;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_98;
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_70;
  list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
  *local_58;
  _List_node_base *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_c0 = (_List_node_base *)&local_70;
  local_70._M_impl._M_node._M_size = 0;
  p_Var7 = (inGlyphsList->
           super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_c8 = (_List_node_base *)inGlyphsList;
  local_b8 = this;
  local_70._M_impl._M_node.super__List_node_base._M_next = local_c0;
  local_70._M_impl._M_node.super__List_node_base._M_prev = local_c0;
  if (p_Var7 != (_List_node_base *)inGlyphsList) {
    do {
      local_a0 = 0;
      local_b0._M_next = &local_b0;
      local_b0._M_prev = local_b0._M_next;
      bVar4 = AddANSICandidates(local_b8,(GlyphUnicodeMappingList *)(p_Var7 + 1),
                                (UShortList *)local_b0._M_next);
      if (!bVar4) goto LAB_001f5710;
      p_Var6 = std::__cxx11::
               list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
               ::
               _M_create_node<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>const&>
                         ((list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
                           *)&local_70,
                          (list<unsigned_short,_std::allocator<unsigned_short>_> *)&local_b0);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      local_70._M_impl._M_node._M_size = local_70._M_impl._M_node._M_size + 1;
      p_Var10 = local_b0._M_next;
      while (p_Var10 != &local_b0) {
        p_Var11 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var10->_M_next
                   )->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var10,0x18);
        p_Var10 = p_Var11;
      }
      local_a0 = 0;
      p_Var7 = (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (bVar4 && p_Var7 != local_c8);
    local_b0._M_next = &local_b0;
    local_b0._M_prev = &local_b0;
    if (!bVar4) {
LAB_001f5710:
      bVar4 = false;
      goto LAB_001f5712;
    }
  }
  local_b0._M_next = &local_b0;
  local_a0 = 0;
  pWVar3 = (local_b8->super_AbstractWrittenFont).mANSIRepresentation;
  local_b0._M_prev = local_b0._M_next;
  local_58 = (list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
              *)outEncodedCharacters;
  if ((pWVar3->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    GlyphEncodingInfo::GlyphEncodingInfo(&local_e8,0,0);
    local_98.first = 0;
    local_98.second.mEncodedCharacter = local_e8.mEncodedCharacter;
    local_98.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_e8.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_98.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_98.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_e8.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_e8.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                *)pWVar3,&local_98);
    if (local_98.second.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.second.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  p_Var7 = local_c8->_M_next;
  if (p_Var7 != local_c8) {
    do {
      local_c0 = (((_List_impl *)&local_c0->_M_next)->_M_node).super__List_node_base._M_next;
      p_Var10 = p_Var7[1]._M_next;
      local_50 = p_Var7;
      if (p_Var10 != p_Var7 + 1) {
        p_Var11 = local_c0 + 1;
        do {
          p_Var11 = p_Var11->_M_next;
          pWVar3 = (local_b8->super_AbstractWrittenFont).mANSIRepresentation;
          p_Var8 = (pWVar3->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
          if (p_Var8 == (_Base_ptr)0x0) {
LAB_001f5618:
            inEncodedCharacter = *(unsigned_short *)&p_Var11[1]._M_next;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_48,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(p_Var10 + 1));
            GlyphEncodingInfo::GlyphEncodingInfo(&local_e8,inEncodedCharacter,&local_48);
            local_98.first = (uint)*(ushort *)((long)(p_Var10 + 2) + 8);
            local_98.second.mEncodedCharacter = local_e8.mEncodedCharacter;
            local_98.second.mUnicodeCharacters.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_e8.mUnicodeCharacters.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_98.second.mUnicodeCharacters.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_e8.mUnicodeCharacters.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_98.second.mUnicodeCharacters.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_e8.mUnicodeCharacters.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_e8.mUnicodeCharacters.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_e8.mUnicodeCharacters.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_e8.mUnicodeCharacters.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
            ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                        *)pWVar3,&local_98);
            if (local_98.second.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.second.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.second.mUnicodeCharacters.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.second.mUnicodeCharacters.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e8.mUnicodeCharacters.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e8.mUnicodeCharacters.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            uVar2 = *(ushort *)((long)(p_Var10 + 2) + 8);
            p_Var1 = &(pWVar3->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = &p_Var1->_M_header;
            do {
              _Var5 = (_Rb_tree_color)uVar2;
              bVar4 = p_Var8[1]._M_color < _Var5;
              if (!bVar4) {
                p_Var9 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[bVar4];
            } while (p_Var8 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var9 == p_Var1) ||
               (_Var5 <= p_Var9[1]._M_color && p_Var9[1]._M_color != (uint)uVar2))
            goto LAB_001f5618;
          }
          p_Var10 = p_Var10->_M_next;
        } while (p_Var10 != p_Var7 + 1);
      }
      p_Var7 = local_50->_M_next;
    } while (p_Var7 != local_c8);
  }
  bVar4 = true;
  if ((list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
       *)&local_70 != local_58) {
    std::__cxx11::
    list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
              (local_58,local_70._M_impl._M_node.super__List_node_base._M_next);
  }
LAB_001f5712:
  p_Var7 = local_b0._M_next;
  while (p_Var7 != &local_b0) {
    p_Var10 = p_Var7->_M_next;
    operator_delete(p_Var7,0x18);
    p_Var7 = p_Var10;
  }
  std::__cxx11::
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::_M_clear(&local_70);
  return bVar4;
}

Assistant:

bool WrittenFontTrueType::AddToANSIRepresentation(	const GlyphUnicodeMappingListList& inGlyphsList,
													UShortListList& outEncodedCharacters)
{
	UShortListList candidatesList;
	UShortList candidates;
	BoolAndByte encodingResult(true,0);
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin(); 
	bool result = true;

	for(; itList != inGlyphsList.end() && result; ++itList)
	{
		result = AddANSICandidates(*itList, candidates);
		if(result)
		{
			candidatesList.push_back(candidates);
			candidates.clear();
		}
	}

	if(result)
	{
		// for the first time, add also 0,0 mapping
		if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
			mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));


		GlyphUnicodeMappingListList::const_iterator itGlyphsList = inGlyphsList.begin();
		UShortListList::iterator itEncodedList = candidatesList.begin();
		GlyphUnicodeMappingList::const_iterator itGlyphs;
		UShortList::iterator itEncoded;

		for(; itGlyphsList != inGlyphsList.end(); ++ itGlyphsList,++itEncodedList)
		{
			itGlyphs = itGlyphsList->begin();
			itEncoded = itEncodedList->begin();
			for(; itGlyphs != itGlyphsList->end(); ++ itGlyphs,++itEncoded)
			{
				if(mANSIRepresentation->mGlyphIDToEncodedChar.find(itGlyphs->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
					mANSIRepresentation->mGlyphIDToEncodedChar.insert(
					UIntToGlyphEncodingInfoMap::value_type(itGlyphs->mGlyphCode,GlyphEncodingInfo(*itEncoded,itGlyphs->mUnicodeValues)));
			}
		}

		outEncodedCharacters = candidatesList;
	}

	return result;	
}